

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

void __thiscall Fl_Type::move_before(Fl_Type *this,Fl_Type *g)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  int iVar3;
  Fl_Type *pFVar4;
  Fl_Type **ppFVar5;
  
  iVar3 = this->level;
  pFVar4 = this;
  if (iVar3 != g->level) {
    printf("move_before levels don\'t match! %d %d\n");
    iVar3 = this->level;
  }
  do {
    pFVar4 = pFVar4->next;
    if (pFVar4 == (Fl_Type *)0x0) {
      if (g == (Fl_Type *)0x0) {
        return;
      }
      ppFVar5 = &last;
      pFVar4 = (Fl_Type *)0x0;
      goto LAB_00181416;
    }
  } while (iVar3 < pFVar4->level);
  if (pFVar4 == g) {
    return;
  }
  ppFVar5 = &pFVar4->prev;
LAB_00181416:
  pFVar1 = *ppFVar5;
  pFVar2 = this->prev;
  pFVar2->next = pFVar4;
  *ppFVar5 = pFVar2;
  pFVar4 = g->prev;
  this->prev = pFVar4;
  pFVar1->next = g;
  ppFVar5 = &first;
  if (pFVar4 != (Fl_Type *)0x0) {
    ppFVar5 = &pFVar4->next;
  }
  *ppFVar5 = this;
  g->prev = pFVar1;
  if ((this->parent != (Fl_Type *)0x0) && (iVar3 = (*this->_vptr_Fl_Type[0x17])(this), iVar3 != 0))
  {
    (*this->parent->_vptr_Fl_Type[9])(this->parent,this,g);
  }
  Fl_Browser_::inserting(&widget_browser->super_Fl_Browser_,g,this);
  Fl_Browser_::display(&widget_browser->super_Fl_Browser_,this);
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  return;
}

Assistant:

void Fl_Type::move_before(Fl_Type* g) {
  if (level != g->level) printf("move_before levels don't match! %d %d\n",
				level, g->level);
  Fl_Type* n;
  for (n = next; n && n->level > level; n = n->next) {/*empty*/}
  if (n == g) return;
  Fl_Type *l = n ? n->prev : Fl_Type::last;
  prev->next = n;
  if (n) n->prev = prev; else Fl_Type::last = prev;
  prev = g->prev;
  l->next = g;
  if (prev) prev->next = this; else Fl_Type::first = this;
  g->prev = l;
  if (parent && is_widget()) parent->move_child(this,g);
  widget_browser->inserting(g, this);
  widget_browser->display(this);
  widget_browser->redraw();
}